

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void activate_table(ecs_world_t *world,ecs_query_t *query,ecs_table_t *table,_Bool active)

{
  ecs_vector_t *vector;
  ecs_table_t *table_00;
  int32_t iVar1;
  long *plVar2;
  void *pvVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  uint index;
  ulong uVar6;
  int iVar7;
  char cVar8;
  ulong uVar9;
  ecs_vector_t *dst_array;
  uint local_60;
  uint local_5c;
  ecs_world_t *local_58;
  ecs_vector_t *local_50;
  ulong local_48;
  long *local_40;
  ecs_table_t *local_38;
  
  uVar4 = CONCAT71(in_register_00000009,active);
  uVar9 = uVar4 & 0xffffffff;
  vector = (&query->tables)[uVar4 & 0xffffffff];
  dst_array = (&query->tables)[(byte)((byte)uVar9 ^ 1)];
  local_38 = table;
  plVar2 = (long *)_ecs_map_get(query->table_indices,0x10,(ulong)table->id);
  table_00 = local_38;
  if (plVar2 == (long *)0x0) goto LAB_00117cf6;
  uVar6 = 0;
  uVar5 = (ulong)*(uint *)(plVar2 + 1);
  if ((int)*(uint *)(plVar2 + 1) < 1) {
    uVar5 = uVar6;
  }
  local_60 = (uint)active;
  iVar7 = 0;
  local_5c = (uint)uVar4;
  local_58 = world;
  local_50 = vector;
  local_48 = uVar5;
  local_40 = plVar2;
  for (; cVar8 = (char)uVar9, uVar5 != uVar6; uVar6 = uVar6 + 1) {
    index = *(uint *)(*plVar2 + uVar6 * 4);
    if ((int)index < 0) {
      if (cVar8 != '\0') {
        index = ~index;
        goto LAB_00117bdb;
      }
    }
    else if (cVar8 == '\0') {
LAB_00117bdb:
      pvVar3 = _ecs_vector_get(vector,0x50,0x10,index);
      _ecs_assert(*(ecs_table_t **)((long)pvVar3 + 8) == table_00,0xc,(char *)0x0,
                  "mt->iter_data.table == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x6f2);
      if (*(ecs_table_t **)((long)pvVar3 + 8) != table_00) {
        __assert_fail("mt->iter_data.table == table",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x6f2,
                      "void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)");
      }
      iVar7 = iVar7 + 1;
      iVar1 = move_table(query,table_00,index,&dst_array,vector,SUB41(local_60,0));
      *(int32_t *)(*local_40 + uVar6 * 4) = iVar1;
      uVar9 = (ulong)local_5c;
      uVar5 = local_48;
      plVar2 = local_40;
    }
  }
  if ((iVar7 == 0) || (query->system == 0)) {
    if (cVar8 == '\0') goto LAB_00117cd5;
LAB_00117ca0:
    query->tables = dst_array;
  }
  else {
    iVar1 = ecs_vector_count(dst_array);
    if (cVar8 != '\0') {
      if (iVar1 == 1) {
        ecs_system_activate(local_58,query->system,true,(EcsSystem *)0x0);
      }
      goto LAB_00117ca0;
    }
    iVar1 = ecs_vector_count(local_50);
    if (iVar1 == 0) {
      ecs_system_activate(local_58,query->system,false,(EcsSystem *)0x0);
    }
LAB_00117cd5:
    query->empty_tables = dst_array;
  }
  if (iVar7 != 0) {
    query->needs_reorder = true;
    return;
  }
LAB_00117cf6:
  _ecs_assert((_Bool)((byte)(query->flags >> 8) & 1),0xc,(char *)0x0,
              "(query->flags & EcsQueryIsSubquery) != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
              ,0x716);
  if ((query->flags & 0x100) != 0) {
    return;
  }
  __assert_fail("(query->flags & (256)) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x716,"void activate_table(ecs_world_t *, ecs_query_t *, ecs_table_t *, _Bool)");
}

Assistant:

static
void activate_table(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_table_t *table,
    bool active)
{
    (void)world;
    
    ecs_vector_t *src_array, *dst_array;
    int32_t activated = 0;

    if (active) {
        src_array = query->empty_tables;
        dst_array = query->tables;
    } else {
        src_array = query->tables;
        dst_array = query->empty_tables;
    }

    ecs_table_indices_t *ti = ecs_map_get(
        query->table_indices, ecs_table_indices_t, table->id);

    if (ti) {
        int32_t i, count = ti->count;
        for (i = 0; i < count; i ++) {
            int32_t index = ti->indices[i];

            if (index < 0) {
                if (!active) {
                    /* If table is already inactive, no need to move */
                    continue;
                }
                index = index * -1 - 1;
            } else {
                if (active) {
                    /* If table is already active, no need to move */
                    continue;
                }
            }

            ecs_matched_table_t *mt = ecs_vector_get(
                src_array, ecs_matched_table_t, index);
            ecs_assert(mt->iter_data.table == table, ECS_INTERNAL_ERROR, NULL);
            (void)mt;
            
            activated ++;

            ti->indices[i] = move_table(
                query, table, index, &dst_array, src_array, active);
        }

        if (activated) {
            /* Activate system if registered with query */
#ifdef FLECS_SYSTEMS_H
            if (query->system) {
                int32_t dst_count = ecs_vector_count(dst_array);
                if (active) {
                    if (dst_count == 1) {
                        ecs_system_activate(world, query->system, true, NULL);
                    }
                } else if (ecs_vector_count(src_array) == 0) {
                    ecs_system_activate(world, query->system, false, NULL);
                }
            }
#endif
        }

        if (active)  {
            query->tables = dst_array;
        } else {
            query->empty_tables = dst_array;
        }
    }
    
    if (!activated) {
        /* Received an activate event for a table we're not matched with. This
         * can only happen if this is a subquery */
        ecs_assert((query->flags & EcsQueryIsSubquery) != 0, 
            ECS_INTERNAL_ERROR, NULL);
        return;
    }

    /* Signal query it needs to reorder tables. Doing this in place could slow
     * down scenario's where a large number of tables is matched with an ordered
     * query. Since each table would trigger the activate signal, there would be
     * as many sorts as added tables, vs. only one when ordering happens when an
     * iterator is obtained. */
    query->needs_reorder = true;
}